

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O3

void eltcalc::WriteOutput(char *buffer,int strLen,FILE *outFile)

{
  float fVar1;
  void *__src;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  size_type __n;
  float *__dest;
  ulong uVar6;
  float *extraout_RDX;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  long lVar11;
  void *pvVar12;
  uint uVar13;
  ulong uVar14;
  void *pvVar15;
  int iVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  
  uVar14 = 1;
  pcVar8 = buffer;
  while( true ) {
    pcVar10 = "%s";
    uVar5 = fprintf((FILE *)outFile,"%s",pcVar8);
    if ((int)uVar5 < 0) {
      WriteOutput((eltcalc *)buffer);
      auVar4 = _DAT_00106040;
      auVar3 = _DAT_00106030;
      auVar2 = _DAT_00106020;
      __src = *(void **)((new_allocator<float> *)buffer + 8);
      pcVar8 = (char *)((long)__src - *(long *)buffer >> 2);
      uVar14 = (long)pcVar10 - (long)pcVar8;
      if (pcVar10 >= pcVar8 && uVar14 != 0) {
        if (uVar14 != 0) {
          pvVar15 = *(void **)((new_allocator<float> *)buffer + 8);
          if ((ulong)(*(long *)((new_allocator<float> *)buffer + 0x10) - (long)pvVar15 >> 2) <
              uVar14) {
            __n = std::vector<float,_std::allocator<float>_>::_M_check_len
                            ((vector<float,_std::allocator<float>_> *)buffer,uVar14,
                             "vector::_M_fill_insert");
            lVar11 = (long)__src - *(long *)buffer >> 2;
            if (__n == 0) {
              __dest = (float *)0x0;
            }
            else {
              __dest = __gnu_cxx::new_allocator<float>::allocate
                                 ((new_allocator<float> *)buffer,__n,(void *)0x0);
            }
            auVar4 = _DAT_00106040;
            auVar3 = _DAT_00106030;
            auVar2 = _DAT_00106020;
            fVar1 = *extraout_RDX;
            uVar6 = uVar14 + 0x3fffffffffffffff & 0x3fffffffffffffff;
            auVar21._8_4_ = (int)uVar6;
            auVar21._0_8_ = uVar6;
            auVar21._12_4_ = (int)(uVar6 >> 0x20);
            lVar7 = 0;
            auVar21 = auVar21 ^ _DAT_00106040;
            do {
              auVar25._8_4_ = (int)lVar7;
              auVar25._0_8_ = lVar7;
              auVar25._12_4_ = (int)((ulong)lVar7 >> 0x20);
              auVar27 = (auVar25 | auVar3) ^ auVar4;
              iVar20 = auVar21._4_4_;
              if ((bool)(~(auVar27._4_4_ == iVar20 && auVar21._0_4_ < auVar27._0_4_ ||
                          iVar20 < auVar27._4_4_) & 1)) {
                __dest[lVar11 + lVar7] = fVar1;
              }
              if ((auVar27._12_4_ != auVar21._12_4_ || auVar27._8_4_ <= auVar21._8_4_) &&
                  auVar27._12_4_ <= auVar21._12_4_) {
                __dest[lVar11 + lVar7 + 1] = fVar1;
              }
              auVar27 = (auVar25 | auVar2) ^ auVar4;
              iVar26 = auVar27._4_4_;
              if (iVar26 <= iVar20 && (iVar26 != iVar20 || auVar27._0_4_ <= auVar21._0_4_)) {
                __dest[lVar11 + lVar7 + 2] = fVar1;
                __dest[lVar11 + lVar7 + 3] = fVar1;
              }
              lVar7 = lVar7 + 4;
            } while ((uVar6 - ((uint)(uVar14 + 0x3fffffffffffffff) & 3)) + 4 != lVar7);
            sVar9 = (long)__src - (long)*(void **)buffer;
            if (sVar9 != 0) {
              memmove(__dest,*(void **)buffer,sVar9);
            }
            pvVar15 = (void *)((long)__dest + uVar14 * 4 + sVar9);
            sVar9 = *(long *)((new_allocator<float> *)buffer + 8) - (long)__src;
            if (sVar9 != 0) {
              memmove(pvVar15,__src,sVar9);
            }
            if (*(void **)buffer != (void *)0x0) {
              operator_delete(*(void **)buffer);
            }
            *(float **)buffer = __dest;
            *(size_t *)((new_allocator<float> *)buffer + 8) = (long)pvVar15 + sVar9;
            *(float **)((new_allocator<float> *)buffer + 0x10) = __dest + __n;
          }
          else {
            fVar1 = *extraout_RDX;
            sVar9 = (long)pvVar15 - (long)__src;
            lVar11 = uVar14 - ((long)sVar9 >> 2);
            if (uVar14 < (ulong)((long)sVar9 >> 2)) {
              pvVar12 = (void *)((long)pvVar15 + uVar14 * -4);
              memmove(pvVar15,pvVar12,uVar14 * 4);
              *(ulong *)((new_allocator<float> *)buffer + 8) =
                   *(long *)((new_allocator<float> *)buffer + 8) + uVar14 * 4;
              sVar9 = (long)pvVar12 - (long)__src;
              if (sVar9 != 0) {
                memmove((void *)((long)pvVar15 - sVar9),__src,sVar9);
              }
              auVar4 = _DAT_00106040;
              auVar3 = _DAT_00106030;
              auVar2 = _DAT_00106020;
              uVar6 = uVar14 + 0x3fffffffffffffff & 0x3fffffffffffffff;
              auVar16._8_4_ = (int)uVar6;
              auVar16._0_8_ = uVar6;
              auVar16._12_4_ = (int)(uVar6 >> 0x20);
              lVar11 = 0;
              auVar16 = auVar16 ^ _DAT_00106040;
              do {
                auVar22._8_4_ = (int)lVar11;
                auVar22._0_8_ = lVar11;
                auVar22._12_4_ = (int)((ulong)lVar11 >> 0x20);
                auVar27 = (auVar22 | auVar3) ^ auVar4;
                iVar20 = auVar16._4_4_;
                if ((bool)(~(auVar27._4_4_ == iVar20 && auVar16._0_4_ < auVar27._0_4_ ||
                            iVar20 < auVar27._4_4_) & 1)) {
                  *(float *)((long)__src + lVar11 * 4) = fVar1;
                }
                if ((auVar27._12_4_ != auVar16._12_4_ || auVar27._8_4_ <= auVar16._8_4_) &&
                    auVar27._12_4_ <= auVar16._12_4_) {
                  *(float *)((long)__src + lVar11 * 4 + 4) = fVar1;
                }
                auVar27 = (auVar22 | auVar2) ^ auVar4;
                iVar26 = auVar27._4_4_;
                if (iVar26 <= iVar20 && (iVar26 != iVar20 || auVar27._0_4_ <= auVar16._0_4_)) {
                  *(float *)((long)__src + lVar11 * 4 + 8) = fVar1;
                  *(float *)((long)__src + lVar11 * 4 + 0xc) = fVar1;
                }
                lVar11 = lVar11 + 4;
              } while ((uVar6 - ((uint)(uVar14 + 0x3fffffffffffffff) & 3)) + 4 != lVar11);
            }
            else {
              pvVar12 = pvVar15;
              if (lVar11 != 0) {
                pvVar12 = (void *)((long)pvVar15 + lVar11 * 4);
                uVar6 = (uVar14 * 4 - sVar9) - 4;
                auVar27._8_4_ = (int)uVar6;
                auVar27._0_8_ = uVar6;
                auVar27._12_4_ = (int)(uVar6 >> 0x20);
                auVar17._0_8_ = uVar6 >> 2;
                auVar17._8_8_ = auVar27._8_8_ >> 2;
                uVar14 = 0;
                auVar17 = auVar17 ^ _DAT_00106040;
                do {
                  auVar23._8_4_ = (int)uVar14;
                  auVar23._0_8_ = uVar14;
                  auVar23._12_4_ = (int)(uVar14 >> 0x20);
                  auVar27 = (auVar23 | auVar3) ^ auVar4;
                  iVar20 = auVar17._4_4_;
                  if ((bool)(~(auVar27._4_4_ == iVar20 && auVar17._0_4_ < auVar27._0_4_ ||
                              iVar20 < auVar27._4_4_) & 1)) {
                    *(float *)((long)pvVar15 + uVar14 * 4) = fVar1;
                  }
                  if ((auVar27._12_4_ != auVar17._12_4_ || auVar27._8_4_ <= auVar17._8_4_) &&
                      auVar27._12_4_ <= auVar17._12_4_) {
                    *(float *)((long)pvVar15 + uVar14 * 4 + 4) = fVar1;
                  }
                  auVar27 = (auVar23 | auVar2) ^ auVar4;
                  iVar26 = auVar27._4_4_;
                  if (iVar26 <= iVar20 && (iVar26 != iVar20 || auVar27._0_4_ <= auVar17._0_4_)) {
                    *(float *)((long)pvVar15 + uVar14 * 4 + 8) = fVar1;
                    *(float *)((long)pvVar15 + uVar14 * 4 + 0xc) = fVar1;
                  }
                  uVar14 = uVar14 + 4;
                } while (((uVar6 >> 2) + 4 & 0x7ffffffffffffffc) != uVar14);
              }
              *(void **)((new_allocator<float> *)buffer + 8) = pvVar12;
              if ((long)pvVar15 - (long)__src == 0) {
                *(size_t *)((new_allocator<float> *)buffer + 8) = (long)pvVar12 + sVar9;
              }
              else {
                memmove(pvVar12,__src,sVar9);
                *(size_t *)((new_allocator<float> *)buffer + 8) =
                     *(long *)((new_allocator<float> *)buffer + 8) + sVar9;
                auVar4 = _DAT_00106040;
                auVar3 = _DAT_00106030;
                auVar2 = _DAT_00106020;
                uVar6 = ((long)pvVar15 - (long)__src) - 4;
                auVar18._8_4_ = (int)uVar6;
                auVar18._0_8_ = uVar6;
                auVar18._12_4_ = (int)(uVar6 >> 0x20);
                auVar19._0_8_ = uVar6 >> 2;
                auVar19._8_8_ = auVar18._8_8_ >> 2;
                uVar14 = 0;
                auVar19 = auVar19 ^ _DAT_00106040;
                do {
                  auVar24._8_4_ = (int)uVar14;
                  auVar24._0_8_ = uVar14;
                  auVar24._12_4_ = (int)(uVar14 >> 0x20);
                  auVar27 = (auVar24 | auVar3) ^ auVar4;
                  iVar20 = auVar19._4_4_;
                  if ((bool)(~(auVar27._4_4_ == iVar20 && auVar19._0_4_ < auVar27._0_4_ ||
                              iVar20 < auVar27._4_4_) & 1)) {
                    *(float *)((long)__src + uVar14 * 4) = fVar1;
                  }
                  if ((auVar27._12_4_ != auVar19._12_4_ || auVar27._8_4_ <= auVar19._8_4_) &&
                      auVar27._12_4_ <= auVar19._12_4_) {
                    *(float *)((long)__src + uVar14 * 4 + 4) = fVar1;
                  }
                  auVar27 = (auVar24 | auVar2) ^ auVar4;
                  iVar26 = auVar27._4_4_;
                  if (iVar26 <= iVar20 && (iVar26 != iVar20 || auVar27._0_4_ <= auVar19._0_4_)) {
                    *(float *)((long)__src + uVar14 * 4 + 8) = fVar1;
                    *(float *)((long)__src + uVar14 * 4 + 0xc) = fVar1;
                  }
                  uVar14 = uVar14 + 4;
                } while (((uVar6 >> 2) + 4 & 0x7ffffffffffffffc) != uVar14);
              }
            }
          }
        }
        return;
      }
      if ((pcVar10 < pcVar8) &&
         (pvVar15 = (void *)(*(long *)buffer + (long)pcVar10 * 4), __src != pvVar15)) {
        *(void **)((new_allocator<float> *)buffer + 8) = pvVar15;
      }
      return;
    }
    if (strLen - uVar5 == 0 || strLen < (int)uVar5) break;
    pcVar8 = pcVar8 + uVar5;
    fprintf(_stderr,"INFO: Attempt %d to write %s\n",uVar14,buffer);
    uVar13 = (int)uVar14 + 1;
    uVar14 = (ulong)uVar13;
    strLen = strLen - uVar5;
    if (uVar13 == 0xb) {
      WriteOutput((eltcalc *)buffer);
      return;
    }
  }
  return;
}

Assistant:

inline void WriteOutput(const char * buffer, int strLen, FILE * outFile)
	{
		const char * bufPtr = buffer;
		int num;
		int counter = 0;
		do {

			num = fprintf(outFile, "%s", bufPtr);
			if (num < 0) {   // Write error
				fprintf(stderr, "FATAL: Error writing %s: %s\n",
					buffer, strerror(errno));
				exit(EXIT_FAILURE);
			} else if (num < strLen) {   // Incomplete write
				bufPtr += num;
				strLen -= num;
			} else return;   // Success

			fprintf(stderr, "INFO: Attempt %d to write %s\n",
				++counter, buffer);

		} while (counter < 10);

		fprintf(stderr, "FATAL: Maximum attempts to write %s exceeded\n",
			buffer);
		exit(EXIT_FAILURE);
	}